

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O3

void set_multi_layer_params
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,GF_GROUP *gf_group,
               PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,FRAME_INFO *frame_info,int start,int end,
               int *cur_frame_idx,int *frame_ind,int *parallel_frame_count,int max_parallel_frames,
               int do_frame_parallel_encode,int *first_frame_index,int *cur_disp_idx,int layer_depth
               )

{
  int iVar1;
  int *cur_disp_idx_00;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000003c;
  int iVar10;
  
  cur_disp_idx_00 = (int *)((ulong)cur_disp_idx & 0xffffffff);
  piVar7 = (int *)CONCAT44(in_stack_00000014,end);
  if (start - (int)frame_info < 3 || gf_group->max_layer_depth_allowed < (int)(uint)cur_disp_idx) {
    uVar5 = (ulong)frame_info & 0xffffffff;
  }
  else {
    do {
      iVar1 = (start + -1 + (int)frame_info) / 2;
      gf_group->update_type[*cur_frame_idx] = '\x06';
      iVar9 = iVar1 - (int)frame_info;
      gf_group->arf_src_offset[*cur_frame_idx] = (uchar)iVar9;
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar7;
      gf_group->display_idx[*cur_frame_idx] =
           (uint)gf_group->arf_src_offset[*cur_frame_idx] + *first_frame_index;
      iVar8 = (int)cur_disp_idx_00;
      gf_group->layer_depth[*cur_frame_idx] = iVar8;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      if ((max_parallel_frames != 0) && (*frame_ind <= (int)parallel_frame_count && 1 < *frame_ind))
      {
        if (gf_group->arf_src_offset[*cur_frame_idx] < 7) {
          gf_group->frame_parallel_level[*cur_frame_idx] = 2;
        }
        *frame_ind = 1;
      }
      iVar10 = *cur_frame_idx;
      if (0 < gf_group->frame_parallel_level[iVar10]) {
        iVar3 = *piVar7;
        if (gf_group->frame_parallel_level[iVar10] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar3;
          iVar6 = iVar3;
        }
        else {
          iVar6 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
        }
        gf_group->src_offset[iVar10] = (iVar3 - iVar6) + (uint)gf_group->arf_src_offset[iVar10];
      }
      iVar10 = 0;
      iVar9 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,iVar1,start - iVar1,
                                 iVar9,(int *)0x0,(int *)0x0,0);
      gf_group->arf_boost[*cur_frame_idx] = iVar9;
      *cur_frame_idx = *cur_frame_idx + 1;
      cur_disp_idx._0_4_ = iVar8 + 1;
      cur_disp_idx_00 = (int *)(ulong)(uint)cur_disp_idx;
      set_multi_layer_params
                (twopass,twopass_frame,gf_group,p_rc,rc,frame_info,iVar1,end,cur_frame_idx,frame_ind
                 ,(int *)((ulong)parallel_frame_count & 0xffffffff),max_parallel_frames,
                 do_frame_parallel_encode,first_frame_index,cur_disp_idx_00,iVar10);
      piVar7 = (int *)CONCAT44(in_stack_00000014,end);
      gf_group->update_type[*cur_frame_idx] = '\x05';
      gf_group->arf_src_offset[*cur_frame_idx] = '\0';
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar7;
      gf_group->display_idx[*cur_frame_idx] = *first_frame_index;
      gf_group->arf_boost[*cur_frame_idx] = 0;
      gf_group->layer_depth[*cur_frame_idx] = iVar8;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      iVar9 = *cur_frame_idx;
      if (0 < gf_group->frame_parallel_level[iVar9]) {
        iVar10 = *piVar7;
        if (gf_group->frame_parallel_level[iVar9] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar10;
          iVar3 = iVar10;
        }
        else {
          iVar3 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
        }
        gf_group->src_offset[iVar9] = (iVar10 - iVar3) + (uint)gf_group->arf_src_offset[iVar9];
        iVar9 = *cur_frame_idx;
      }
      *cur_frame_idx = iVar9 + 1;
      *piVar7 = *piVar7 + 1;
      *first_frame_index = *first_frame_index + 1;
      uVar4 = iVar1 + 1;
      uVar5 = (ulong)uVar4;
    } while ((iVar8 < gf_group->max_layer_depth_allowed) &&
            (frame_info = (FRAME_INFO *)(ulong)uVar4, 2 < (int)(start - uVar4)));
  }
  iVar9 = start - (int)uVar5;
  if (iVar9 != 0 && (int)uVar5 <= start) {
    do {
      gf_group->update_type[*cur_frame_idx] = '\x01';
      gf_group->arf_src_offset[*cur_frame_idx] = '\0';
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar7;
      gf_group->display_idx[*cur_frame_idx] = *first_frame_index;
      gf_group->layer_depth[*cur_frame_idx] = 6;
      iVar1 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,(int)uVar5,iVar9,0,
                                 (int *)0x0,(int *)0x0,0);
      gf_group->arf_boost[*cur_frame_idx] = iVar1;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      uVar4 = gf_group->max_layer_depth;
      if (gf_group->max_layer_depth <= (int)(uint)cur_disp_idx) {
        uVar4 = (uint)cur_disp_idx;
      }
      gf_group->max_layer_depth = uVar4;
      iVar1 = *cur_frame_idx;
      lVar2 = (long)iVar1;
      if (max_parallel_frames != 0) {
        gf_group->frame_parallel_level[lVar2] = (1 < *frame_ind) + 1;
        iVar1 = *frame_ind + 1;
        if ((int)parallel_frame_count <= *frame_ind) {
          iVar1 = 1;
        }
        *frame_ind = iVar1;
        iVar1 = *cur_frame_idx;
        lVar2 = (long)iVar1;
        gf_group->is_frame_non_ref[lVar2] = true;
      }
      piVar7 = (int *)CONCAT44(in_stack_00000014,end);
      if (0 < gf_group->frame_parallel_level[lVar2]) {
        iVar1 = *piVar7;
        if (gf_group->frame_parallel_level[lVar2] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar1;
          iVar8 = iVar1;
        }
        else {
          iVar8 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
        }
        gf_group->src_offset[lVar2] = (iVar1 - iVar8) + (uint)gf_group->arf_src_offset[lVar2];
        iVar1 = *cur_frame_idx;
      }
      *cur_frame_idx = iVar1 + 1;
      *piVar7 = *piVar7 + 1;
      *first_frame_index = *first_frame_index + 1;
      uVar5 = (ulong)((int)uVar5 + 1);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  return;
}

Assistant:

static void set_multi_layer_params(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    GF_GROUP *const gf_group, const PRIMARY_RATE_CONTROL *p_rc,
    RATE_CONTROL *rc, FRAME_INFO *frame_info, int start, int end,
    int *cur_frame_idx, int *frame_ind, int *parallel_frame_count,
    int max_parallel_frames, int do_frame_parallel_encode,
    int *first_frame_index, int *cur_disp_idx, int layer_depth) {
  const int num_frames_to_process = end - start;

  // Either we are at the last level of the pyramid, or we don't have enough
  // frames between 'l' and 'r' to create one more level.
  if (layer_depth > gf_group->max_layer_depth_allowed ||
      num_frames_to_process < 3) {
    // Leaf nodes.
    while (start < end) {
      gf_group->update_type[*frame_ind] = LF_UPDATE;
      gf_group->arf_src_offset[*frame_ind] = 0;
      gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
      gf_group->display_idx[*frame_ind] = *cur_disp_idx;
      gf_group->layer_depth[*frame_ind] = MAX_ARF_LAYERS;
      gf_group->arf_boost[*frame_ind] =
          av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, start,
                             end - start, 0, NULL, NULL, 0);
      gf_group->frame_type[*frame_ind] = INTER_FRAME;
      gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
      gf_group->max_layer_depth =
          AOMMAX(gf_group->max_layer_depth, layer_depth);
      // Set the level of parallelism for the LF_UPDATE frame.
      if (do_frame_parallel_encode) {
        set_frame_parallel_level(&gf_group->frame_parallel_level[*frame_ind],
                                 parallel_frame_count, max_parallel_frames);
        // Set LF_UPDATE frames as non-reference frames.
        gf_group->is_frame_non_ref[*frame_ind] = true;
      }
      set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
      ++(*frame_ind);
      ++(*cur_frame_idx);
      ++(*cur_disp_idx);
      ++start;
    }
  } else {
    const int m = (start + end - 1) / 2;

    // Internal ARF.
    gf_group->update_type[*frame_ind] = INTNL_ARF_UPDATE;
    gf_group->arf_src_offset[*frame_ind] = m - start;
    gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
    gf_group->display_idx[*frame_ind] =
        *cur_disp_idx + gf_group->arf_src_offset[*frame_ind];
    gf_group->layer_depth[*frame_ind] = layer_depth;
    gf_group->frame_type[*frame_ind] = INTER_FRAME;
    gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;

    if (do_frame_parallel_encode) {
      // If max_parallel_frames is not exceeded and if the frame will not be
      // temporally filtered, encode the next internal ARF frame in parallel.
      if (*parallel_frame_count > 1 &&
          *parallel_frame_count <= max_parallel_frames) {
        if (gf_group->arf_src_offset[*frame_ind] < TF_LOOKAHEAD_IDX_THR)
          gf_group->frame_parallel_level[*frame_ind] = 2;
        *parallel_frame_count = 1;
      }
    }
    set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);

    // Get the boost factor for intermediate ARF frames.
    gf_group->arf_boost[*frame_ind] =
        av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, m, end - m,
                           m - start, NULL, NULL, 0);
    ++(*frame_ind);

    // Frames displayed before this internal ARF.
    set_multi_layer_params(twopass, twopass_frame, gf_group, p_rc, rc,
                           frame_info, start, m, cur_frame_idx, frame_ind,
                           parallel_frame_count, max_parallel_frames,
                           do_frame_parallel_encode, first_frame_index,
                           cur_disp_idx, layer_depth + 1);

    // Overlay for internal ARF.
    gf_group->update_type[*frame_ind] = INTNL_OVERLAY_UPDATE;
    gf_group->arf_src_offset[*frame_ind] = 0;
    gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
    gf_group->display_idx[*frame_ind] = *cur_disp_idx;
    gf_group->arf_boost[*frame_ind] = 0;
    gf_group->layer_depth[*frame_ind] = layer_depth;
    gf_group->frame_type[*frame_ind] = INTER_FRAME;
    gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;

    set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
    ++(*frame_ind);
    ++(*cur_frame_idx);
    ++(*cur_disp_idx);

    // Frames displayed after this internal ARF.
    set_multi_layer_params(twopass, twopass_frame, gf_group, p_rc, rc,
                           frame_info, m + 1, end, cur_frame_idx, frame_ind,
                           parallel_frame_count, max_parallel_frames,
                           do_frame_parallel_encode, first_frame_index,
                           cur_disp_idx, layer_depth + 1);
  }
}